

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

int __thiscall
TPZSkylMatrix<std::complex<double>_>::Zero(TPZSkylMatrix<std::complex<double>_> *this)

{
  undefined8 *puVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (this->fStorage).fNElements;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      puVar1 = (undefined8 *)(((this->fStorage).fStore)->_M_value + lVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar3 = lVar3 + 0x10;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  return 1;
}

Assistant:

void TPZVec<T>::Fill(const T& copy, const int64_t from, const int64_t numelem){
#ifndef PZNODEBUG
	if(numelem<0 && numelem != -1) {
		PZError << "TPZVec::Fill" << std::endl
		<< "It's negative parameter numelem, then numelem = "
		<< fNElements << std::endl;
		
		PZError.flush();
	}
#endif
	
	int64_t first = (from < 0) ? 0 : from;
	int64_t nel = numelem;
	first = (first > fNElements) ? fNElements : first;
	if (nel < 0) nel = fNElements;
	int64_t last = (from+nel > fNElements) ? fNElements : from+nel;
	
	for(int64_t i=first; i<last; i++)
		fStore[i] = copy;
}